

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

bool __thiscall
InstanceIsLessThanComparator::operator()
          (InstanceIsLessThanComparator *this,shared_ptr<Instance> *lhs,shared_ptr<Instance> *rhs)

{
  int iVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  bool bVar5;
  Context *this_00;
  undefined8 *puVar6;
  byte bVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  string rhs_type;
  string lhs_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string
            ((string *)&lhs_type,
             (string *)
             &((lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_type);
  std::__cxx11::string::string
            ((string *)&rhs_type,
             (string *)
             &((rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_type);
  this_00 = Context::get_instance();
  fVar9 = Context::get_float_comparison_tolerance(this_00);
  bVar5 = std::operator==(&lhs_type,"Boolean");
  if (bVar5) {
    bVar5 = std::operator==(&rhs_type,"Boolean");
    if (bVar5) {
      bVar7 = (*(byte *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                         _vptr_Instance ^ 1) &
              *(byte *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                        _vptr_Instance;
      goto LAB_0014fe0e;
    }
  }
  bVar5 = std::operator==(&lhs_type,"Character");
  if (bVar5) {
    bVar5 = std::operator==(&rhs_type,"Character");
    if (!bVar5) goto LAB_0014fc94;
    cVar2 = *(char *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                      _vptr_Instance;
    cVar3 = *(char *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                      _vptr_Instance;
    bVar8 = SBORROW1(cVar2,cVar3);
    bVar5 = (char)(cVar2 - cVar3) < '\0';
LAB_0014fcc8:
    bVar7 = bVar8 != bVar5;
    goto LAB_0014fe0e;
  }
LAB_0014fc94:
  bVar5 = std::operator==(&lhs_type,"Integer");
  if (bVar5) {
    bVar5 = std::operator==(&rhs_type,"Integer");
    if (bVar5) {
      iVar4 = *(int *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                       _vptr_Instance;
      iVar1 = *(int *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                       _vptr_Instance;
      bVar8 = SBORROW4(iVar4,iVar1);
      bVar5 = iVar4 - iVar1 < 0;
      goto LAB_0014fcc8;
    }
  }
  bVar5 = std::operator==(&lhs_type,"Integer");
  if (bVar5) {
    bVar5 = std::operator==(&rhs_type,"Float");
    if (!bVar5) goto LAB_0014fd03;
    fVar10 = (float)*(int *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                             [1]._vptr_Instance;
LAB_0014fd33:
    fVar10 = fVar10 - *(float *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr[1]._vptr_Instance;
    bVar5 = -fVar9 == fVar10;
    bVar8 = -fVar9 < fVar10;
LAB_0014fd97:
    bVar7 = !bVar8 && !bVar5;
LAB_0014fe0e:
    std::__cxx11::string::~string((string *)&rhs_type);
    std::__cxx11::string::~string((string *)&lhs_type);
    return (bool)bVar7;
  }
LAB_0014fd03:
  bVar5 = std::operator==(&lhs_type,"Float");
  if (bVar5) {
    bVar5 = std::operator==(&rhs_type,"Float");
    if (bVar5) {
      fVar10 = *(float *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                          _vptr_Instance;
      goto LAB_0014fd33;
    }
  }
  bVar5 = std::operator==(&lhs_type,"Float");
  if (bVar5) {
    bVar5 = std::operator==(&rhs_type,"Integer");
    if (bVar5) {
      fVar10 = *(float *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                          _vptr_Instance -
               (float)*(int *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr[1]._vptr_Instance;
      bVar5 = -fVar9 == fVar10;
      bVar8 = -fVar9 < fVar10;
      goto LAB_0014fd97;
    }
  }
  bVar5 = std::operator==(&lhs_type,"String");
  if (bVar5) {
    bVar5 = std::operator==(&rhs_type,"String");
    if (bVar5) {
      std::__cxx11::string::string
                ((string *)&local_58,
                 (string *)
                 ((lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1));
      std::__cxx11::string::string
                ((string *)&local_38,
                 (string *)
                 ((rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1));
      bVar7 = std::operator<(&local_58,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      goto LAB_0014fe0e;
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "RuntimeError: cannot compare these two types.";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

bool InstanceIsLessThanComparator::operator()(const std::shared_ptr<Instance>& lhs,
                                              const std::shared_ptr<Instance>& rhs) const {
    const std::string lhs_type = lhs->type();
    const std::string rhs_type = rhs->type();
    float eps = Context::get_instance()->get_float_comparison_tolerance();
    if (lhs_type == "Boolean" && rhs_type == "Boolean")
        return static_cast<const BooleanInstance&>(*lhs).value() < static_cast<const BooleanInstance&>(*rhs).value();
    if (lhs_type == "Character" && rhs_type == "Character")
        return static_cast<const CharacterInstance&>(*lhs).value() <
               static_cast<const CharacterInstance&>(*rhs).value();
    if (lhs_type == "Integer" && rhs_type == "Integer")
        return static_cast<const IntegerInstance&>(*lhs).value() < static_cast<const IntegerInstance&>(*rhs).value();
    if (lhs_type == "Integer" && rhs_type == "Float")
        return float(static_cast<const IntegerInstance&>(*lhs).value()) -
               static_cast<const FloatInstance&>(*rhs).value() < -eps;
    if (lhs_type == "Float" && rhs_type == "Float")
        return static_cast<const FloatInstance&>(*lhs).value() - static_cast<const FloatInstance&>(*rhs).value() < -eps;
    if (lhs_type == "Float" && rhs_type == "Integer")
        return static_cast<const FloatInstance&>(*lhs).value() -
               float(static_cast<const IntegerInstance&>(*rhs).value()) < -eps;
    if (lhs_type == "String" && rhs_type == "String")
        return static_cast<const StringInstance&>(*lhs).value() < static_cast<const StringInstance&>(*rhs).value();
    throw EXC_INVALID_COMPARISON;
}